

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_operators.hpp
# Opt level: O2

type * __thiscall
Disa::projection_orthogonal<double,0ul,0ul>
          (type *__return_storage_ptr__,Disa *this,Vector_Dense<double,_0UL> *vector_0,
          Vector_Dense<double,_0UL> *vector_1)

{
  ostream *poVar1;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _return_vector vector;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined **local_28;
  
  if (*(long *)(this + 8) - *(long *)this ==
      (long)(vector_0->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(vector_0->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start) {
    local_108._8_8_ = 0;
    local_f0 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_operators.hpp:186:25)>
               ::_M_invoke;
    local_f8 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_operators.hpp:186:25)>
               ::_M_manager;
    local_108._M_unused._0_8_ = (undefined8)this;
    Vector_Dense<double,_0UL>::Vector_Dense
              (&vector,(function<double_(unsigned_long)> *)&local_108,
               *(long *)(this + 8) - *(long *)this >> 3);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    projection_tangent<double,0ul,0ul>((type *)&local_108,this,vector_0,vector_1);
    operator-(__return_storage_ptr__,&vector,(Vector_Dense<double,_0UL> *)&local_108);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_108);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&vector);
    return __return_storage_ptr__;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_28 = &PTR_s__workspace_llm4binary_github_lic_00154988;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
             (Disa *)0x0,(Log_Level)&local_28,(source_location *)vector_1);
  poVar1 = std::operator<<(poVar1,(string *)local_108._M_pod_data);
  std::__cxx11::to_string(&local_a8,*(long *)(this + 8) - *(long *)this >> 3);
  std::operator+(&local_88,"Incompatible vector sizes, ",&local_a8);
  std::operator+(&local_68,&local_88," vs. ");
  std::__cxx11::to_string
            (&local_c8,
             (long)(vector_0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector_0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_48,&local_68,&local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vector,
                 &local_48,".");
  poVar1 = std::operator<<(poVar1,(string *)&vector);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&vector);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  exit(1);
}

Assistant:

constexpr typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type
projection_orthogonal(const Vector_Dense<_type, _size_0>& vector_0, const Vector_Dense<_type, _size_1>& vector_1) {
  ASSERT_DEBUG(vector_0.size() == vector_1.size(), "Incompatible vector sizes, " + std::to_string(vector_0.size()) +
                                                   " vs. " + std::to_string(vector_1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  _return_vector vector([&](const std::size_t index) { return vector_0[index]; }, vector_1.size());
  return vector - projection_tangent(vector_0, vector_1);
}